

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfparse.c
# Opt level: O2

int parser_bare_item(sf_parser *sfp,sf_value *dest)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint8_t *base;
  uint8_t *puVar4;
  uint8_t *puVar5;
  long lVar6;
  long lVar7;
  uint8_t *puVar8;
  uint uVar9;
  uint32_t uVar10;
  sf_value val;
  
  puVar4 = sfp->pos;
  iVar2 = -1;
  switch(*puVar4) {
  case '\"':
    uVar10 = 0;
    lVar7 = 1;
    while( true ) {
      puVar5 = puVar4 + lVar7;
      sfp->pos = puVar5;
      if (puVar5 == sfp->end) break;
      switch(*puVar5) {
      case '\"':
        if (dest != (sf_value *)0x0) {
          dest->type = SF_TYPE_STRING;
          dest->flags = uVar10;
          (dest->field_2).decimal.denom = lVar7 + -1;
          puVar4 = puVar4 + 1;
          if (lVar7 == 1) {
            puVar4 = (uint8_t *)0x0;
          }
          (dest->field_2).vec.base = puVar4;
          puVar5 = sfp->pos;
        }
        sfp->pos = puVar5 + 1;
        goto LAB_00115d82;
      case '\\':
        puVar5 = puVar4 + lVar7 + 1;
        sfp->pos = puVar5;
        if (puVar5 == sfp->end) {
          return -1;
        }
        lVar7 = lVar7 + 1;
        uVar10 = 1;
        if ((*puVar5 != '\"') && (*puVar5 != '\\')) {
          return -1;
        }
      case ' ':
      case '!':
      case '#':
      case '$':
      case '%':
      case '&':
      case '\'':
      case '(':
      case ')':
      case '*':
      case '+':
      case ',':
      case '-':
      case '.':
      case '/':
      case '0':
      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
      case ':':
      case ';':
      case '<':
      case '=':
      case '>':
      case '?':
      case '@':
      case 'A':
      case 'B':
      case 'C':
      case 'D':
      case 'E':
      case 'F':
      case 'G':
      case 'H':
      case 'I':
      case 'J':
      case 'K':
      case 'L':
      case 'M':
      case 'N':
      case 'O':
      case 'P':
      case 'Q':
      case 'R':
      case 'S':
      case 'T':
      case 'U':
      case 'V':
      case 'W':
      case 'X':
      case 'Y':
      case 'Z':
      case '[':
      case ']':
      case '^':
      case '_':
      case '`':
      case 'a':
      case 'b':
      case 'c':
      case 'd':
      case 'e':
      case 'f':
      case 'g':
      case 'h':
      case 'i':
      case 'j':
      case 'k':
      case 'l':
      case 'm':
      case 'n':
      case 'o':
      case 'p':
      case 'q':
      case 'r':
      case 's':
      case 't':
      case 'u':
      case 'v':
      case 'w':
      case 'x':
      case 'y':
      case 'z':
      case '{':
      case '|':
      case '}':
      case '~':
        lVar7 = lVar7 + 1;
        break;
      default:
        goto switchD_00115bcc_caseD_23;
      }
    }
    break;
  case '*':
  case 'A':
  case 'B':
  case 'C':
  case 'D':
  case 'E':
  case 'F':
  case 'G':
  case 'H':
  case 'I':
  case 'J':
  case 'K':
  case 'L':
  case 'M':
  case 'N':
  case 'O':
  case 'P':
  case 'Q':
  case 'R':
  case 'S':
  case 'T':
  case 'U':
  case 'V':
  case 'W':
  case 'X':
  case 'Y':
  case 'Z':
  case 'a':
  case 'b':
  case 'c':
  case 'd':
  case 'e':
  case 'f':
  case 'g':
  case 'h':
  case 'i':
  case 'j':
  case 'k':
  case 'l':
  case 'm':
  case 'n':
  case 'o':
  case 'p':
  case 'q':
  case 'r':
  case 's':
  case 't':
  case 'u':
  case 'v':
  case 'w':
  case 'x':
  case 'y':
  case 'z':
    puVar5 = puVar4;
    while( true ) {
      puVar5 = puVar5 + 1;
      sfp->pos = puVar5;
      if (puVar5 == sfp->end) break;
      switch(*puVar5) {
      case '!':
      case '#':
      case '$':
      case '%':
      case '&':
      case '\'':
      case '*':
      case '+':
      case '-':
      case '.':
      case '/':
      case '0':
      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
      case ':':
      case 'A':
      case 'B':
      case 'C':
      case 'D':
      case 'E':
      case 'F':
      case 'G':
      case 'H':
      case 'I':
      case 'J':
      case 'K':
      case 'L':
      case 'M':
      case 'N':
      case 'O':
      case 'P':
      case 'Q':
      case 'R':
      case 'S':
      case 'T':
      case 'U':
      case 'V':
      case 'W':
      case 'X':
      case 'Y':
      case 'Z':
      case '^':
      case '_':
      case '`':
      case 'a':
      case 'b':
      case 'c':
      case 'd':
      case 'e':
      case 'f':
      case 'g':
      case 'h':
      case 'i':
      case 'j':
      case 'k':
      case 'l':
      case 'm':
      case 'n':
      case 'o':
      case 'p':
      case 'q':
      case 'r':
      case 's':
      case 't':
      case 'u':
      case 'v':
      case 'w':
      case 'x':
      case 'y':
      case 'z':
      case '|':
      case '~':
        break;
      default:
        goto switchD_00115bfa_caseD_22;
      }
    }
switchD_00115bfa_caseD_22:
    iVar2 = 0;
    if (dest != (sf_value *)0x0) {
      dest->type = SF_TYPE_TOKEN;
      dest->flags = 0;
      (dest->field_2).vec.base = puVar4;
      (dest->field_2).decimal.denom = (long)sfp->pos - (long)puVar4;
    }
    break;
  case '-':
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
    iVar2 = parser_number(sfp,dest);
    return iVar2;
  case ':':
    puVar5 = sfp->end;
    lVar7 = 1;
    lVar6 = 2;
LAB_00115cbb:
    sfp->pos = puVar4 + lVar7;
    if (puVar4 + lVar7 == puVar5) {
      return -1;
    }
    switch(puVar4[lVar6 + -1]) {
    case '+':
    case '/':
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
    case 'A':
    case 'B':
    case 'C':
    case 'D':
    case 'E':
    case 'F':
    case 'G':
    case 'H':
    case 'I':
    case 'J':
    case 'K':
    case 'L':
    case 'M':
    case 'N':
    case 'O':
    case 'P':
    case 'Q':
    case 'R':
    case 'S':
    case 'T':
    case 'U':
    case 'V':
    case 'W':
    case 'X':
    case 'Y':
    case 'Z':
    case 'a':
    case 'b':
    case 'c':
    case 'd':
    case 'e':
    case 'f':
    case 'g':
    case 'h':
    case 'i':
    case 'j':
    case 'k':
    case 'l':
    case 'm':
    case 'n':
    case 'o':
    case 'p':
    case 'q':
    case 'r':
    case 's':
    case 't':
    case 'u':
    case 'v':
    case 'w':
    case 'x':
    case 'y':
    case 'z':
      goto switchD_00115ce6_caseD_2b;
    default:
      return -1;
    case ':':
      if (((int)lVar6 + 2U & 3) != 0) {
        return -1;
      }
      break;
    case '=':
      uVar9 = (int)lVar6 + 2U & 3;
      if (uVar9 < 2) {
        return -1;
      }
      if (uVar9 == 3) {
        bVar1 = puVar4[lVar6 + -2];
        if (((0x3f < bVar1 - 0x30) ||
            ((0x8888022222220111U >> ((ulong)(bVar1 - 0x30) & 0x3f) & 1) == 0)) &&
           ((bVar1 != 0x73 && (bVar1 != 0x77)))) {
          return -1;
        }
      }
      else {
        if (0x36 < puVar4[lVar6 + -2] - 0x41) {
          return -1;
        }
        if ((0x40004000010001U >> ((ulong)(puVar4[lVar6 + -2] - 0x41) & 0x3f) & 1) == 0) {
          return -1;
        }
        puVar8 = puVar4 + lVar6;
        sfp->pos = puVar8;
        if (puVar8 == puVar5) {
          return -1;
        }
        lVar7 = lVar6;
        if (*puVar8 != '=') {
          return -1;
        }
      }
      puVar8 = puVar4 + lVar7 + 1;
      sfp->pos = puVar8;
      if (puVar8 == puVar5) {
        return -1;
      }
      if (*puVar8 != ':') {
        return -1;
      }
      lVar7 = lVar7 + 1;
    }
    if (dest == (sf_value *)0x0) {
      puVar4 = puVar4 + lVar7;
    }
    else {
      dest->type = SF_TYPE_BYTESEQ;
      dest->flags = 0;
      (dest->field_2).decimal.denom = lVar7 + -1;
      puVar4 = puVar4 + 1;
      if (lVar7 == 1) {
        puVar4 = (uint8_t *)0x0;
      }
      (dest->field_2).vec.base = puVar4;
      puVar4 = sfp->pos;
    }
    sfp->pos = puVar4 + 1;
    goto LAB_00115d82;
  case '?':
    puVar5 = puVar4 + 1;
    sfp->pos = puVar5;
    if (puVar5 != sfp->end) {
      iVar2 = 0;
      if (*puVar5 != '0') {
        if (*puVar5 != '1') {
          return -1;
        }
        iVar2 = 1;
      }
      sfp->pos = puVar4 + 2;
      if (dest != (sf_value *)0x0) {
        dest->type = SF_TYPE_BOOLEAN;
        dest->flags = 0;
        (dest->field_2).boolean = iVar2;
      }
LAB_00115d82:
      iVar2 = 0;
    }
    break;
  case '@':
    sfp->pos = puVar4 + 1;
    if ((((puVar4 + 1 != sfp->end) && (iVar3 = parser_number(sfp,&val), iVar3 == 0)) &&
        (val.type == SF_TYPE_INTEGER)) && (iVar2 = 0, dest != (sf_value *)0x0)) {
      dest->type = 1;
      dest->flags = val.flags;
      (dest->field_2).integer = val.field_2.integer;
      (dest->field_2).decimal.denom = val.field_2.decimal.denom;
      dest->type = SF_TYPE_DATE;
    }
  }
switchD_00115bcc_caseD_23:
  return iVar2;
switchD_00115ce6_caseD_2b:
  lVar7 = lVar7 + 1;
  lVar6 = lVar6 + 1;
  goto LAB_00115cbb;
}

Assistant:

static int parser_bare_item(sf_parser *sfp, sf_value *dest) {
  switch (*sfp->pos) {
  case '"':
    return parser_string(sfp, dest);
  case '-':
  DIGIT_CASES:
    return parser_number(sfp, dest);
  case '@':
    return parser_date(sfp, dest);
  case ':':
    return parser_byteseq(sfp, dest);
  case '?':
    return parser_boolean(sfp, dest);
  case '*':
  ALPHA_CASES:
    return parser_token(sfp, dest);
  default:
    return SF_ERR_PARSE_ERROR;
  }
}